

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O2

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
jessilib::ustring_to_mbstring<char8_t>
          (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,jessilib *this,
          basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string)

{
  ulong __n;
  char8_t *pcVar1;
  size_t sVar2;
  char8_t *extraout_RDX;
  char8_t *pcVar3;
  decode_result dVar4;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_00;
  mbstate_t mbstate;
  char buffer [16];
  undefined8 local_50;
  char local_48 [24];
  
  pcVar1 = (char8_t *)in_string._M_len;
  __return_storage_ptr__->first = false;
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_string_length = 0;
  (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
  local_50 = 0;
  pcVar3 = pcVar1;
  while( true ) {
    in_string_00._M_str = pcVar1;
    in_string_00._M_len = (size_t)pcVar3;
    dVar4 = decode_codepoint_utf8<char8_t>(this,in_string_00);
    sVar2 = dVar4.units;
    if (sVar2 == 0) {
      __return_storage_ptr__->first = true;
      return __return_storage_ptr__;
    }
    __n = c32rtomb(local_48,dVar4.codepoint,&local_50);
    if (0x10 < __n) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&__return_storage_ptr__->second,local_48,__n);
    pcVar3 = pcVar3 + sVar2;
    this = this + -sVar2;
    pcVar1 = extraout_RDX;
  }
  __return_storage_ptr__->first = false;
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::string> ustring_to_mbstring(std::basic_string_view<CharT> in_string) {
	std::pair<bool, std::string> result;

	std::mbstate_t mbstate{};
	decode_result decode;
	while ((decode = decode_codepoint(in_string)).units != 0) {
		in_string.remove_prefix(decode.units);

		char buffer[MB_LEN_MAX]; // MB_LEN_MAX is constant, MB_CUR_MAX is not, and C++ doesn't have VLAs
		size_t bytes_written = std::c32rtomb(buffer, decode.codepoint, &mbstate);
		if (bytes_written > MB_LEN_MAX) {
			// Invalid codepoint; return
			result.first = false;
			return result;
		}

		result.second.append(buffer, bytes_written);
	}

	result.first = true;
	return result;
}